

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

void udata_initHashTable(UErrorCode *err)

{
  gCommonDataCache = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,err);
  if (U_ZERO_ERROR < *err) {
    return;
  }
  uhash_setValueDeleter_63(gCommonDataCache,DataCacheElement_deleter);
  ucln_common_registerCleanup_63(UCLN_COMMON_UDATA,udata_cleanup);
  return;
}

Assistant:

static void U_CALLCONV udata_initHashTable(UErrorCode &err) {
    U_ASSERT(gCommonDataCache == NULL);
    gCommonDataCache = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &err);
    if (U_FAILURE(err)) {
       return;
    }
    U_ASSERT(gCommonDataCache != NULL);
    uhash_setValueDeleter(gCommonDataCache, DataCacheElement_deleter);
    ucln_common_registerCleanup(UCLN_COMMON_UDATA, udata_cleanup);
}